

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::ConvertToGrayScale
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uchar *puVar6;
  uchar *puVar7;
  long lVar8;
  uchar *puVar9;
  uchar *puVar10;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  if (in->_colorCount == '\x01') {
    Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
    return;
  }
  uVar2 = out->_rowSize;
  if (height * uVar2 != 0) {
    puVar6 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar2);
    uVar3 = in->_rowSize;
    puVar10 = puVar6 + height * uVar2;
    puVar7 = in->_data + (ulong)(startXIn * 3) + (ulong)(startYIn * uVar3);
    do {
      if (width != 0) {
        lVar8 = 0;
        puVar9 = puVar6;
        do {
          pbVar1 = puVar7 + lVar8;
          lVar4 = lVar8 + 1;
          lVar5 = lVar8 + 2;
          lVar8 = lVar8 + 3;
          *puVar9 = (uchar)(((uint)puVar7[lVar5] + (uint)puVar7[lVar4] + (uint)*pbVar1) / 3);
          puVar9 = puVar9 + 1;
        } while ((ulong)width * 3 != lVar8);
      }
      puVar6 = puVar6 + uVar2;
      puVar7 = puVar7 + uVar3;
    } while (puVar6 != puVar10);
  }
  return;
}

Assistant:

void ConvertToGrayScale( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                             uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( out );

        if( in.colorCount() == GRAY_SCALE ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = RGB;

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, inX += colorCount )
                (*outX) = static_cast <uint8_t>((*(inX) + *(inX + 1) + *(inX + 2)) / 3u); // average of red, green and blue components
        }
    }